

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpectralTransform.cpp
# Opt level: O3

TPZAutoPointer<TPZMatrix<double>_> __thiscall
TPZSTShiftOrigin<double>::CalcMatrix
          (TPZSTShiftOrigin<double> *this,TPZAutoPointer<TPZMatrix<double>_> *A,
          TPZAutoPointer<TPZMatrix<double>_> *B)

{
  atomic_int *paVar1;
  TPZReference *pTVar2;
  TPZSpectralTransform<double> TVar3;
  long lVar4;
  long *plVar5;
  int iVar6;
  undefined8 *in_RCX;
  long lVar7;
  double local_38;
  
  iVar6 = (**(code **)(**(long **)*in_RCX + 0x80))();
  (**(code **)((ulong)(iVar6 != 0) * 0x20 + 0xb8 + **(long **)*in_RCX))();
  TVar3 = (TPZSpectralTransform<double>)B->fRef;
  this->super_TPZSpectralTransform<double> = TVar3;
  LOCK();
  paVar1 = (atomic_int *)((long)TVar3 + 8);
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  lVar4 = (B->fRef->fPointer->super_TPZBaseMatrix).fRow;
  if (0 < lVar4) {
    pTVar2 = A[1].fRef;
    TVar3 = this->super_TPZSpectralTransform<double>;
    lVar7 = 0;
    do {
      plVar5 = *(long **)TVar3;
      local_38 = (double)(**(code **)(*plVar5 + 0x120))(plVar5,lVar7,lVar7);
      local_38 = local_38 - (double)pTVar2;
      (**(code **)(*plVar5 + 0x118))(plVar5,lVar7,lVar7,&local_38);
      lVar7 = lVar7 + 1;
    } while (lVar4 != lVar7);
  }
  return (TPZAutoPointer<TPZMatrix<double>_>)(TPZReference *)this;
}

Assistant:

TPZAutoPointer<TPZMatrix<TVar>>
TPZSTShiftOrigin<TVar>::CalcMatrix(TPZAutoPointer<TPZMatrix<TVar>>A, TPZAutoPointer<TPZMatrix<TVar>>B) const
{
  if (B->IsSymmetric()) B->Decompose_LDLt();
  else B->Decompose_LU();
  TPZAutoPointer<TPZMatrix<TVar>> shiftedMat = A;
  //b-1 * shiftedA will be computed at the arnoldi iteration
  const auto &shift = Shift();
  const auto nRows = A->Rows();
  for(int i = 0; i < nRows; i++) shiftedMat->PutVal(i,i,shiftedMat->GetVal(i,i)-shift);
  return shiftedMat;
}